

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  undefined8 *puVar4;
  ulong uVar5;
  mpt_iterator *it;
  double val;
  long *local_48;
  ulong local_40;
  undefined8 local_38;
  
  if (1 < argc) {
    local_40 = (ulong)(uint)argc;
    uVar5 = 1;
    do {
      plVar2 = (long *)mpt_iterator_create(argv[uVar5]);
      if (plVar2 == (long *)0x0) {
        main_cold_4();
        puVar4 = (undefined8 *)&stderr;
      }
      else {
        (**(code **)*plVar2)(plVar2,0x86,&local_48);
        do {
          lVar3 = (**(code **)*local_48)();
          if (lVar3 == 0) {
            main_cold_3();
            break;
          }
          iVar1 = mpt_value_convert(lVar3,100,&local_38);
          if (iVar1 < 0) {
            main_cold_2();
            break;
          }
          fprintf(_stdout,"%g ",local_38);
          iVar1 = (**(code **)(*local_48 + 8))();
          if (iVar1 < 0) {
            main_cold_1();
            break;
          }
        } while (iVar1 != 0);
        (**(code **)(*plVar2 + 8))(plVar2);
        puVar4 = (undefined8 *)&stdout;
      }
      fputc(10,(FILE *)*puVar4);
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_40);
  }
  return 0;
}

Assistant:

extern int main(int argc, char *argv[])
{
	int i;
	
	for (i = 1; i < argc; ++i) {
		MPT_INTERFACE(metatype) *src;
		MPT_INTERFACE(iterator) *it;
		if (!(src = mpt_iterator_create(argv[i]))) {
			fputs("bad format <", stderr);
			fputs(argv[i], stderr);
			fputc('>', stderr);
			fputc('\n', stderr);
			continue;
		}
		MPT_metatype_convert(src, MPT_ENUM(TypeIteratorPtr), &it);
		while (1) {
			const MPT_STRUCT(value) *src;
			double val;
			int res;
			if (!(src = it->_vptr->value(it))) {
				fprintf(stderr, "%s\n", "value query error");
				break;
			}
			if ((res = mpt_value_convert(src, 'd', &val)) < 0) {
				fprintf(stderr, "%s: %d\n", "conversion error", -res);
				break;
			}
			fprintf(stdout, "%g ", val);
			
			if ((res = it->_vptr->advance(it)) < 0) {
				fprintf(stderr, "%s: %d\n", "advance error", -res);
				break;
			}
			if (!res) {
				break;
			}
		}
		src->_vptr->unref(src);
		fputc('\n', stdout);
	}
	return 0;
}